

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

drwav_uint64 drwav_write(drwav *pWav,drwav_uint64 samplesToWrite,void *pData)

{
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  size_t sVar5;
  
  if (pData == (void *)0x0 || (samplesToWrite == 0 || pWav == (drwav *)0x0)) {
    return 0;
  }
  uVar2 = (ulong)pWav->bitsPerSample;
  if (samplesToWrite * uVar2 < 8) {
    uVar4 = 0;
  }
  else {
    sVar5 = samplesToWrite * uVar2 >> 3;
    lVar3 = 0;
    do {
      sVar1 = (*pWav->onWrite)(pWav->pUserData,pData,sVar5);
      pWav->dataChunkDataSize = pWav->dataChunkDataSize + sVar1;
      if (sVar1 == 0) break;
      lVar3 = lVar3 + sVar1;
      pData = (void *)((long)pData + sVar1);
      sVar5 = sVar5 - sVar1;
    } while (sVar5 != 0);
    uVar2 = (ulong)pWav->bitsPerSample;
    uVar4 = lVar3 << 3;
  }
  return uVar4 / uVar2;
}

Assistant:

drwav_uint64 drwav_write(drwav* pWav, drwav_uint64 samplesToWrite, const void* pData)
{
    if (pWav == NULL || samplesToWrite == 0 || pData == NULL) {
        return 0;
    }

    drwav_uint64 bytesToWrite = ((samplesToWrite * pWav->bitsPerSample) / 8);
    if (bytesToWrite > DRWAV_SIZE_MAX) {
        return 0;
    }

    drwav_uint64 bytesWritten = 0;
    const drwav_uint8* pRunningData = (const drwav_uint8*)pData;
    while (bytesToWrite > 0) {
        drwav_uint64 bytesToWriteThisIteration = bytesToWrite;
        if (bytesToWriteThisIteration > DRWAV_SIZE_MAX) {
            bytesToWriteThisIteration = DRWAV_SIZE_MAX;
        }

        size_t bytesJustWritten = drwav_write_raw(pWav, (size_t)bytesToWriteThisIteration, pRunningData);
        if (bytesJustWritten == 0) {
            break;
        }

        bytesToWrite -= bytesJustWritten;
        bytesWritten += bytesJustWritten;
        pRunningData += bytesJustWritten;
    }

    return (bytesWritten * 8) / pWav->bitsPerSample;
}